

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_tEXt(ucvector *out,char *keyword,char *textstring)

{
  long in_RDX;
  long in_RSI;
  ucvector text;
  size_t i;
  uint error;
  ucvector *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  uchar *in_stack_ffffffffffffffc8;
  ulong uVar1;
  char *chunkName;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  uint local_4;
  
  uVar2 = 0;
  ucvector_init((ucvector *)&stack0xffffffffffffffb8);
  for (uVar1 = 0; *(char *)(in_RSI + uVar1) != '\0'; uVar1 = uVar1 + 1) {
    ucvector_push_back(in_stack_ffffffffffffffb8,'\0');
  }
  if ((uVar1 == 0) || (0x4f < uVar1)) {
    local_4 = 0x59;
  }
  else {
    ucvector_push_back(in_stack_ffffffffffffffb8,'\0');
    for (chunkName = (char *)0x0; chunkName[in_RDX] != '\0'; chunkName = chunkName + 1) {
      ucvector_push_back(in_stack_ffffffffffffffb8,'\0');
    }
    local_4 = addChunk((ucvector *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),chunkName,
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    ucvector_cleanup((void *)0x113d41);
  }
  return local_4;
}

Assistant:

static unsigned addChunk_tEXt(ucvector* out, const char* keyword, const char* textstring)
{
  unsigned error = 0;
  size_t i;
  ucvector text;
  ucvector_init(&text);
  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&text, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&text, 0); /*0 termination char*/
  for(i = 0; textstring[i] != 0; ++i) ucvector_push_back(&text, (unsigned char)textstring[i]);
  error = addChunk(out, "tEXt", text.data, text.size);
  ucvector_cleanup(&text);

  return error;
}